

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O0

int h261_picparm(bitstream *str,h261_picparm *picparm)

{
  int iVar1;
  int iVar2;
  bitstream *in_RSI;
  uint32_t pei;
  int in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  if ((iVar1 == 0) &&
     (iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc), iVar1 == 0)) {
    if ((*(uint *)&in_RSI->field_0x4 & 1) == 0) {
      fprintf(_stderr,"Spare bit unset - H.263 stream?\n");
    }
    else {
      iVar1 = 0;
      iVar2 = vs_u(in_RSI,(uint32_t *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      while (iVar2 == 0) {
        if (iVar1 == 0) {
          return 0;
        }
        iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
      }
    }
  }
  return 1;
}

Assistant:

int h261_picparm(struct bitstream *str, struct h261_picparm *picparm) {
	if (vs_u(str, &picparm->tr, 5)) return 1;
	if (vs_u(str, &picparm->ptype, 6)) return 1;
	if (!(picparm->ptype & 1)) {
		fprintf(stderr, "Spare bit unset - H.263 stream?\n");
		return 1;
	}
	uint32_t pei = 0;
	if (vs_u(str, &pei, 1)) return 1;
	while (pei) {
		if (vs_u(str, &pei, 8)) return 1;
		if (vs_u(str, &pei, 1)) return 1;
	}
	return 0;
}